

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::InputFile::Data::deleteCachedBuffer(Data *this)

{
  bool bVar1;
  Slice *pSVar2;
  ArgExc *this_00;
  long in_RDI;
  Slice *s;
  Iterator k;
  FrameBuffer *in_stack_ffffffffffffff88;
  void *pvVar3;
  ConstIterator *in_stack_ffffffffffffff90;
  
  if (*(long *)(in_RDI + 0xc0) != 0) {
    FrameBuffer::begin(in_stack_ffffffffffffff88);
    while( true ) {
      FrameBuffer::ConstIterator::ConstIterator
                (in_stack_ffffffffffffff90,(Iterator *)in_stack_ffffffffffffff88);
      FrameBuffer::end(in_stack_ffffffffffffff88);
      FrameBuffer::ConstIterator::ConstIterator
                (in_stack_ffffffffffffff90,(Iterator *)in_stack_ffffffffffffff88);
      bVar1 = Imf_3_2::operator!=(in_stack_ffffffffffffff90,
                                  (ConstIterator *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      pSVar2 = FrameBuffer::Iterator::slice((Iterator *)0x21e55d);
      switch(pSVar2->type) {
      case UINT:
        if (pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 4 != (char *)0x0) {
          operator_delete__(pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 4);
        }
        break;
      case HALF:
        if (pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 2 != (char *)0x0) {
          operator_delete__(pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 2);
        }
        break;
      case FLOAT:
        if (pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 4 != (char *)0x0) {
          operator_delete__(pSVar2->base + (long)*(int *)(in_RDI + 0xd4) * 4);
        }
        break;
      case NUM_PIXELTYPES:
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this_00,"Invalid pixel type");
        __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      FrameBuffer::Iterator::operator++((Iterator *)in_stack_ffffffffffffff90);
    }
    pvVar3 = *(void **)(in_RDI + 0xc0);
    if (pvVar3 != (void *)0x0) {
      FrameBuffer::~FrameBuffer((FrameBuffer *)0x21e6b0);
      operator_delete(pvVar3,0x30);
    }
    *(undefined8 *)(in_RDI + 0xc0) = 0;
  }
  return;
}

Assistant:

void
InputFile::Data::deleteCachedBuffer ()
{
    //
    // Delete the cached frame buffer, and all memory
    // allocated for the slices in the cached frameBuffer.
    //

    if (cachedBuffer)
    {
        for (FrameBuffer::Iterator k = cachedBuffer->begin ();
             k != cachedBuffer->end ();
             ++k)
        {
            Slice& s = k.slice ();

            switch (s.type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                    delete[](((unsigned int*) s.base) + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                    delete[]((half*) s.base + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                    delete[](((float*) s.base) + offset);
                    break;
                case NUM_PIXELTYPES:
                    throw (IEX_NAMESPACE::ArgExc ("Invalid pixel type"));
            }
        }

        //
        // delete the cached frame buffer
        //

        delete cachedBuffer;
        cachedBuffer = 0;
    }
}